

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkleblock.cpp
# Opt level: O3

uint256 * __thiscall
CPartialMerkleTree::TraverseAndExtract
          (uint256 *__return_storage_ptr__,CPartialMerkleTree *this,int height,uint pos,
          uint *nBitsUsed,uint *nHashUsed,vector<uint256,_std::allocator<uint256>_> *vMatch,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *vnIndex)

{
  pointer *ppuVar1;
  uint uVar2;
  _Bit_type *p_Var3;
  pointer puVar4;
  iterator __position;
  iterator __position_00;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  base_blob<256U> *pbVar8;
  ulong uVar9;
  uint256 *__args;
  int height_00;
  long in_FS_OFFSET;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Span<unsigned_char> output;
  uint pos_local;
  uint256 local_e8;
  uint256 left;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  uint64_t local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = *nBitsUsed;
  p_Var3 = (this->vBits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
           ._M_start.super__Bit_iterator_base._M_p;
  pos_local = pos;
  if ((ulong)uVar2 <
      (ulong)(this->vBits).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
      ((long)(this->vBits).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var3) * 8) {
    *nBitsUsed = uVar2 + 1;
    uVar9 = 1L << ((byte)uVar2 & 0x3f) & p_Var3[uVar2 >> 6];
    if ((height == 0) || (uVar9 == 0)) {
      uVar2 = *nHashUsed;
      puVar4 = (this->vHash).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->vHash).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar4 >> 5) <= (ulong)uVar2)
      goto LAB_0035656a;
      *nHashUsed = uVar2 + 1;
      __args = puVar4 + uVar2;
      if (uVar9 != 0 && height == 0) {
        __position._M_current =
             (vMatch->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (vMatch->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<uint256,std::allocator<uint256>>::_M_realloc_insert<uint256_const&>
                    ((vector<uint256,std::allocator<uint256>> *)vMatch,__position,__args);
        }
        else {
          uVar5 = *(undefined8 *)(__args->super_base_blob<256U>).m_data._M_elems;
          uVar6 = *(undefined8 *)((__args->super_base_blob<256U>).m_data._M_elems + 8);
          uVar7 = *(undefined8 *)((__args->super_base_blob<256U>).m_data._M_elems + 0x18);
          *(undefined8 *)(((__position._M_current)->super_base_blob<256U>).m_data._M_elems + 0x10) =
               *(undefined8 *)((__args->super_base_blob<256U>).m_data._M_elems + 0x10);
          *(undefined8 *)(((__position._M_current)->super_base_blob<256U>).m_data._M_elems + 0x18) =
               uVar7;
          *(undefined8 *)((__position._M_current)->super_base_blob<256U>).m_data._M_elems = uVar5;
          *(undefined8 *)(((__position._M_current)->super_base_blob<256U>).m_data._M_elems + 8) =
               uVar6;
          ppuVar1 = &(vMatch->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + 1;
        }
        __position_00._M_current =
             (vnIndex->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position_00._M_current ==
            (vnIndex->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)vnIndex,__position_00,
                     &pos_local);
        }
        else {
          *__position_00._M_current = pos;
          (vnIndex->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position_00._M_current + 1;
        }
      }
      uVar5 = *(undefined8 *)(__args->super_base_blob<256U>).m_data._M_elems;
      uVar6 = *(undefined8 *)((__args->super_base_blob<256U>).m_data._M_elems + 8);
      uVar7 = *(undefined8 *)((__args->super_base_blob<256U>).m_data._M_elems + 0x18);
      *(undefined8 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x10) =
           *(undefined8 *)((__args->super_base_blob<256U>).m_data._M_elems + 0x10);
      *(undefined8 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x18) =
           uVar7;
      *(undefined8 *)(__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems = uVar5;
      *(undefined8 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 8) = uVar6;
    }
    else {
      height_00 = height + -1;
      TraverseAndExtract(&left,this,height_00,pos * 2,nBitsUsed,nHashUsed,vMatch,vnIndex);
      local_e8.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      local_e8.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      local_e8.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      local_e8.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      local_e8.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      local_e8.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      local_e8.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      local_e8.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      local_e8.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      local_e8.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      local_e8.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      local_e8.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      local_e8.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      local_e8.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      local_e8.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      local_e8.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      local_e8.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      local_e8.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      local_e8.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      local_e8.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      local_e8.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      local_e8.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      local_e8.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      local_e8.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      local_e8.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      local_e8.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      local_e8.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      local_e8.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      local_e8.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      local_e8.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      local_e8.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      local_e8.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      uVar2 = pos * 2 + 1;
      if (uVar2 < ~(-1 << ((byte)height_00 & 0x1f)) + this->nTransactions >>
                  ((byte)height_00 & 0x1f)) {
        TraverseAndExtract(&local_e8,this,height_00,uVar2,nBitsUsed,nHashUsed,vMatch,vnIndex);
        auVar11[0] = -(left.super_base_blob<256U>.m_data._M_elems[0x10] ==
                      local_e8.super_base_blob<256U>.m_data._M_elems[0x10]);
        auVar11[1] = -(left.super_base_blob<256U>.m_data._M_elems[0x11] ==
                      local_e8.super_base_blob<256U>.m_data._M_elems[0x11]);
        auVar11[2] = -(left.super_base_blob<256U>.m_data._M_elems[0x12] ==
                      local_e8.super_base_blob<256U>.m_data._M_elems[0x12]);
        auVar11[3] = -(left.super_base_blob<256U>.m_data._M_elems[0x13] ==
                      local_e8.super_base_blob<256U>.m_data._M_elems[0x13]);
        auVar11[4] = -(left.super_base_blob<256U>.m_data._M_elems[0x14] ==
                      local_e8.super_base_blob<256U>.m_data._M_elems[0x14]);
        auVar11[5] = -(left.super_base_blob<256U>.m_data._M_elems[0x15] ==
                      local_e8.super_base_blob<256U>.m_data._M_elems[0x15]);
        auVar11[6] = -(left.super_base_blob<256U>.m_data._M_elems[0x16] ==
                      local_e8.super_base_blob<256U>.m_data._M_elems[0x16]);
        auVar11[7] = -(left.super_base_blob<256U>.m_data._M_elems[0x17] ==
                      local_e8.super_base_blob<256U>.m_data._M_elems[0x17]);
        auVar11[8] = -(left.super_base_blob<256U>.m_data._M_elems[0x18] ==
                      local_e8.super_base_blob<256U>.m_data._M_elems[0x18]);
        auVar11[9] = -(left.super_base_blob<256U>.m_data._M_elems[0x19] ==
                      local_e8.super_base_blob<256U>.m_data._M_elems[0x19]);
        auVar11[10] = -(left.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                       local_e8.super_base_blob<256U>.m_data._M_elems[0x1a]);
        auVar11[0xb] = -(left.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                        local_e8.super_base_blob<256U>.m_data._M_elems[0x1b]);
        auVar11[0xc] = -(left.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                        local_e8.super_base_blob<256U>.m_data._M_elems[0x1c]);
        auVar11[0xd] = -(left.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                        local_e8.super_base_blob<256U>.m_data._M_elems[0x1d]);
        auVar11[0xe] = -(left.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                        local_e8.super_base_blob<256U>.m_data._M_elems[0x1e]);
        auVar11[0xf] = -(left.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                        local_e8.super_base_blob<256U>.m_data._M_elems[0x1f]);
        auVar10[0] = -(left.super_base_blob<256U>.m_data._M_elems[0] ==
                      local_e8.super_base_blob<256U>.m_data._M_elems[0]);
        auVar10[1] = -(left.super_base_blob<256U>.m_data._M_elems[1] ==
                      local_e8.super_base_blob<256U>.m_data._M_elems[1]);
        auVar10[2] = -(left.super_base_blob<256U>.m_data._M_elems[2] ==
                      local_e8.super_base_blob<256U>.m_data._M_elems[2]);
        auVar10[3] = -(left.super_base_blob<256U>.m_data._M_elems[3] ==
                      local_e8.super_base_blob<256U>.m_data._M_elems[3]);
        auVar10[4] = -(left.super_base_blob<256U>.m_data._M_elems[4] ==
                      local_e8.super_base_blob<256U>.m_data._M_elems[4]);
        auVar10[5] = -(left.super_base_blob<256U>.m_data._M_elems[5] ==
                      local_e8.super_base_blob<256U>.m_data._M_elems[5]);
        auVar10[6] = -(left.super_base_blob<256U>.m_data._M_elems[6] ==
                      local_e8.super_base_blob<256U>.m_data._M_elems[6]);
        auVar10[7] = -(left.super_base_blob<256U>.m_data._M_elems[7] ==
                      local_e8.super_base_blob<256U>.m_data._M_elems[7]);
        auVar10[8] = -(left.super_base_blob<256U>.m_data._M_elems[8] ==
                      local_e8.super_base_blob<256U>.m_data._M_elems[8]);
        auVar10[9] = -(left.super_base_blob<256U>.m_data._M_elems[9] ==
                      local_e8.super_base_blob<256U>.m_data._M_elems[9]);
        auVar10[10] = -(left.super_base_blob<256U>.m_data._M_elems[10] ==
                       local_e8.super_base_blob<256U>.m_data._M_elems[10]);
        auVar10[0xb] = -(left.super_base_blob<256U>.m_data._M_elems[0xb] ==
                        local_e8.super_base_blob<256U>.m_data._M_elems[0xb]);
        auVar10[0xc] = -(left.super_base_blob<256U>.m_data._M_elems[0xc] ==
                        local_e8.super_base_blob<256U>.m_data._M_elems[0xc]);
        auVar10[0xd] = -(left.super_base_blob<256U>.m_data._M_elems[0xd] ==
                        local_e8.super_base_blob<256U>.m_data._M_elems[0xd]);
        auVar10[0xe] = -(left.super_base_blob<256U>.m_data._M_elems[0xe] ==
                        local_e8.super_base_blob<256U>.m_data._M_elems[0xe]);
        auVar10[0xf] = -(left.super_base_blob<256U>.m_data._M_elems[0xf] ==
                        local_e8.super_base_blob<256U>.m_data._M_elems[0xf]);
        auVar10 = auVar10 & auVar11;
        if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) == 0xffff) {
          this->fBad = true;
        }
      }
      else {
        local_e8.super_base_blob<256U>.m_data._M_elems[1] =
             left.super_base_blob<256U>.m_data._M_elems[1];
        local_e8.super_base_blob<256U>.m_data._M_elems[0] =
             left.super_base_blob<256U>.m_data._M_elems[0];
        local_e8.super_base_blob<256U>.m_data._M_elems[2] =
             left.super_base_blob<256U>.m_data._M_elems[2];
        local_e8.super_base_blob<256U>.m_data._M_elems[3] =
             left.super_base_blob<256U>.m_data._M_elems[3];
        local_e8.super_base_blob<256U>.m_data._M_elems[4] =
             left.super_base_blob<256U>.m_data._M_elems[4];
        local_e8.super_base_blob<256U>.m_data._M_elems[5] =
             left.super_base_blob<256U>.m_data._M_elems[5];
        local_e8.super_base_blob<256U>.m_data._M_elems[6] =
             left.super_base_blob<256U>.m_data._M_elems[6];
        local_e8.super_base_blob<256U>.m_data._M_elems[7] =
             left.super_base_blob<256U>.m_data._M_elems[7];
        local_e8.super_base_blob<256U>.m_data._M_elems[9] =
             left.super_base_blob<256U>.m_data._M_elems[9];
        local_e8.super_base_blob<256U>.m_data._M_elems[8] =
             left.super_base_blob<256U>.m_data._M_elems[8];
        local_e8.super_base_blob<256U>.m_data._M_elems[10] =
             left.super_base_blob<256U>.m_data._M_elems[10];
        local_e8.super_base_blob<256U>.m_data._M_elems[0xb] =
             left.super_base_blob<256U>.m_data._M_elems[0xb];
        local_e8.super_base_blob<256U>.m_data._M_elems[0xc] =
             left.super_base_blob<256U>.m_data._M_elems[0xc];
        local_e8.super_base_blob<256U>.m_data._M_elems[0xd] =
             left.super_base_blob<256U>.m_data._M_elems[0xd];
        local_e8.super_base_blob<256U>.m_data._M_elems[0xe] =
             left.super_base_blob<256U>.m_data._M_elems[0xe];
        local_e8.super_base_blob<256U>.m_data._M_elems[0xf] =
             left.super_base_blob<256U>.m_data._M_elems[0xf];
        local_e8.super_base_blob<256U>.m_data._M_elems[0x11] =
             left.super_base_blob<256U>.m_data._M_elems[0x11];
        local_e8.super_base_blob<256U>.m_data._M_elems[0x10] =
             left.super_base_blob<256U>.m_data._M_elems[0x10];
        local_e8.super_base_blob<256U>.m_data._M_elems[0x12] =
             left.super_base_blob<256U>.m_data._M_elems[0x12];
        local_e8.super_base_blob<256U>.m_data._M_elems[0x13] =
             left.super_base_blob<256U>.m_data._M_elems[0x13];
        local_e8.super_base_blob<256U>.m_data._M_elems[0x14] =
             left.super_base_blob<256U>.m_data._M_elems[0x14];
        local_e8.super_base_blob<256U>.m_data._M_elems[0x15] =
             left.super_base_blob<256U>.m_data._M_elems[0x15];
        local_e8.super_base_blob<256U>.m_data._M_elems[0x16] =
             left.super_base_blob<256U>.m_data._M_elems[0x16];
        local_e8.super_base_blob<256U>.m_data._M_elems[0x17] =
             left.super_base_blob<256U>.m_data._M_elems[0x17];
        local_e8.super_base_blob<256U>.m_data._M_elems[0x19] =
             left.super_base_blob<256U>.m_data._M_elems[0x19];
        local_e8.super_base_blob<256U>.m_data._M_elems[0x18] =
             left.super_base_blob<256U>.m_data._M_elems[0x18];
        local_e8.super_base_blob<256U>.m_data._M_elems[0x1a] =
             left.super_base_blob<256U>.m_data._M_elems[0x1a];
        local_e8.super_base_blob<256U>.m_data._M_elems[0x1b] =
             left.super_base_blob<256U>.m_data._M_elems[0x1b];
        local_e8.super_base_blob<256U>.m_data._M_elems[0x1c] =
             left.super_base_blob<256U>.m_data._M_elems[0x1c];
        local_e8.super_base_blob<256U>.m_data._M_elems[0x1d] =
             left.super_base_blob<256U>.m_data._M_elems[0x1d];
        local_e8.super_base_blob<256U>.m_data._M_elems[0x1e] =
             left.super_base_blob<256U>.m_data._M_elems[0x1e];
        local_e8.super_base_blob<256U>.m_data._M_elems[0x1f] =
             left.super_base_blob<256U>.m_data._M_elems[0x1f];
      }
      pbVar8 = &__return_storage_ptr__->super_base_blob<256U>;
      (pbVar8->m_data)._M_elems[0x10] = '\0';
      (pbVar8->m_data)._M_elems[0x11] = '\0';
      (pbVar8->m_data)._M_elems[0x12] = '\0';
      (pbVar8->m_data)._M_elems[0x13] = '\0';
      (pbVar8->m_data)._M_elems[0x14] = '\0';
      (pbVar8->m_data)._M_elems[0x15] = '\0';
      (pbVar8->m_data)._M_elems[0x16] = '\0';
      (pbVar8->m_data)._M_elems[0x17] = '\0';
      (pbVar8->m_data)._M_elems[0x18] = '\0';
      (pbVar8->m_data)._M_elems[0x19] = '\0';
      (pbVar8->m_data)._M_elems[0x1a] = '\0';
      (pbVar8->m_data)._M_elems[0x1b] = '\0';
      (pbVar8->m_data)._M_elems[0x1c] = '\0';
      (pbVar8->m_data)._M_elems[0x1d] = '\0';
      (pbVar8->m_data)._M_elems[0x1e] = '\0';
      (pbVar8->m_data)._M_elems[0x1f] = '\0';
      (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[0] = '\0';
      (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[1] = '\0';
      (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[2] = '\0';
      (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[3] = '\0';
      (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[4] = '\0';
      (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[5] = '\0';
      (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[6] = '\0';
      (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[7] = '\0';
      (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[8] = '\0';
      (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[9] = '\0';
      (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[10] = '\0';
      (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[0xb] = '\0';
      (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[0xc] = '\0';
      (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[0xd] = '\0';
      (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[0xe] = '\0';
      (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[0xf] = '\0';
      local_58 = (undefined1  [16])0x0;
      local_68 = (undefined1  [16])0x0;
      local_78 = (undefined1  [16])0x0;
      local_88 = (undefined1  [16])0x0;
      local_98 = (undefined1  [16])0x0;
      local_a8 = (undefined1  [16])0x0;
      local_48 = 0;
      CSHA256::CSHA256((CSHA256 *)local_a8);
      CSHA256::Write((CSHA256 *)local_a8,(uchar *)&left,0x20);
      CSHA256::Write((CSHA256 *)local_a8,(uchar *)&local_e8,0x20);
      output.m_size = 0x20;
      output.m_data = (uchar *)__return_storage_ptr__;
      CHash256::Finalize((CHash256 *)local_a8,output);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_0035669d:
      __stack_chk_fail();
    }
  }
  else {
LAB_0035656a:
    this->fBad = true;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0035669d;
    pbVar8 = &__return_storage_ptr__->super_base_blob<256U>;
    (pbVar8->m_data)._M_elems[0x10] = '\0';
    (pbVar8->m_data)._M_elems[0x11] = '\0';
    (pbVar8->m_data)._M_elems[0x12] = '\0';
    (pbVar8->m_data)._M_elems[0x13] = '\0';
    (pbVar8->m_data)._M_elems[0x14] = '\0';
    (pbVar8->m_data)._M_elems[0x15] = '\0';
    (pbVar8->m_data)._M_elems[0x16] = '\0';
    (pbVar8->m_data)._M_elems[0x17] = '\0';
    (pbVar8->m_data)._M_elems[0x18] = '\0';
    (pbVar8->m_data)._M_elems[0x19] = '\0';
    (pbVar8->m_data)._M_elems[0x1a] = '\0';
    (pbVar8->m_data)._M_elems[0x1b] = '\0';
    (pbVar8->m_data)._M_elems[0x1c] = '\0';
    (pbVar8->m_data)._M_elems[0x1d] = '\0';
    (pbVar8->m_data)._M_elems[0x1e] = '\0';
    (pbVar8->m_data)._M_elems[0x1f] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[0] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[1] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[2] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[3] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[4] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[5] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[6] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[7] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[8] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[9] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[10] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[0xb] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[0xc] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[0xd] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[0xe] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[0xf] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

uint256 CPartialMerkleTree::TraverseAndExtract(int height, unsigned int pos, unsigned int &nBitsUsed, unsigned int &nHashUsed, std::vector<uint256> &vMatch, std::vector<unsigned int> &vnIndex) {
    if (nBitsUsed >= vBits.size()) {
        // overflowed the bits array - failure
        fBad = true;
        return uint256();
    }
    bool fParentOfMatch = vBits[nBitsUsed++];
    if (height==0 || !fParentOfMatch) {
        // if at height 0, or nothing interesting below, use stored hash and do not descend
        if (nHashUsed >= vHash.size()) {
            // overflowed the hash array - failure
            fBad = true;
            return uint256();
        }
        const uint256 &hash = vHash[nHashUsed++];
        if (height==0 && fParentOfMatch) { // in case of height 0, we have a matched txid
            vMatch.push_back(hash);
            vnIndex.push_back(pos);
        }
        return hash;
    } else {
        // otherwise, descend into the subtrees to extract matched txids and hashes
        uint256 left = TraverseAndExtract(height-1, pos*2, nBitsUsed, nHashUsed, vMatch, vnIndex), right;
        if (pos*2+1 < CalcTreeWidth(height-1)) {
            right = TraverseAndExtract(height-1, pos*2+1, nBitsUsed, nHashUsed, vMatch, vnIndex);
            if (right == left) {
                // The left and right branches should never be identical, as the transaction
                // hashes covered by them must each be unique.
                fBad = true;
            }
        } else {
            right = left;
        }
        // and combine them before returning
        return Hash(left, right);
    }
}